

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_luma_planar
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  WORD32 three_nt;
  WORD32 two_nt;
  WORD32 log2nt;
  WORD32 col;
  WORD32 row;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_ref_local;
  
  log2nt._0_1_ = '\x05';
  switch(nt) {
  case 4:
    log2nt._0_1_ = '\x02';
    break;
  default:
    break;
  case 8:
    log2nt._0_1_ = '\x03';
    break;
  case 0x10:
    log2nt._0_1_ = '\x04';
    break;
  case 0x20:
    log2nt._0_1_ = '\x05';
  }
  for (row = 0; row < nt; row = row + 1) {
    for (col = 0; col < nt; col = col + 1) {
      pu1_dst[row * dst_strd + col] =
           (UWORD8)((int)(((nt + -1) - col) * (uint)pu1_ref[(nt * 2 + -1) - row] +
                          (col + 1) * (uint)pu1_ref[nt * 3 + 1] +
                          ((nt + -1) - row) * (uint)pu1_ref[nt * 2 + 1 + col] +
                          (row + 1) * (uint)pu1_ref[nt + -1] + nt) >> (char)log2nt + 1);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_planar(UWORD8 *pu1_ref,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_dst,
                                  WORD32 dst_strd,
                                  WORD32 nt,
                                  WORD32 mode)
{


    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    UNUSED(src_strd);
    UNUSED(mode);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;
    /* Planar filtering */
    for(row = 0; row < nt; row++)
    {
        for(col = 0; col < nt; col++)
        {
            pu1_dst[row * dst_strd + col] = ((nt - 1 - col)
                            * pu1_ref[two_nt - 1 - row]
                            + (col + 1) * pu1_ref[three_nt + 1]
                            + (nt - 1 - row) * pu1_ref[two_nt + 1 + col]
                            + (row + 1) * pu1_ref[nt - 1] + nt) >> (log2nt + 1);
        }
    }
}